

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-gettimeofday.c
# Opt level: O2

int run_test_gettimeofday(void)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  undefined8 uVar5;
  int64_t eval_b;
  int64_t eval_a;
  uv_timeval_t tv;
  
  tv.tv_sec = 0;
  iVar1 = uv_gettimeofday(&tv);
  eval_a = (int64_t)iVar1;
  eval_b = 0;
  if (eval_a == 0) {
    eval_a = 0;
    eval_b = tv.tv_sec;
    if (tv.tv_sec == 0) {
      pcVar3 = "!=";
      pcVar4 = "tv.tv_sec";
      pcVar2 = "0";
      uVar5 = 0x20;
    }
    else {
      iVar1 = uv_gettimeofday((uv_timeval_t *)0x0);
      eval_a = (int64_t)iVar1;
      eval_b = -0x16;
      if (eval_a == -0x16) {
        return 0;
      }
      pcVar3 = "==";
      pcVar4 = "UV_EINVAL";
      pcVar2 = "r";
      uVar5 = 0x24;
    }
  }
  else {
    pcVar3 = "==";
    pcVar4 = "0";
    pcVar2 = "r";
    uVar5 = 0x1f;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-gettimeofday.c"
          ,uVar5,pcVar2,pcVar3,pcVar4,eval_a,pcVar3,eval_b);
  abort();
}

Assistant:

TEST_IMPL(gettimeofday) {
  uv_timeval_t tv;
  int r;

  tv.tv_sec = 0;
  r = uv_gettimeofday(&tv);
  ASSERT_OK(r);
  ASSERT_NE(0, tv.tv_sec);

  /* Test invalid input. */
  r = uv_gettimeofday(NULL);
  ASSERT_EQ(r, UV_EINVAL);

  return 0;
}